

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ExpressionVarVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
          (ExpressionVarVisitor *this,StructuredAssignmentPatternExpression *expr)

{
  size_type sVar1;
  pointer ppEVar2;
  Expression *this_00;
  uint uVar3;
  Symbol *pSVar4;
  long lVar5;
  
  if (((expr->super_AssignmentPatternExpressionBase).super_Expression.kind & ~IntegerLiteral) ==
      NamedValue) {
    pSVar4 = Expression::getSymbolReference((Expression *)expr,true);
    if (((pSVar4 != (Symbol *)0x0) && (uVar3 = pSVar4->kind - Variable, uVar3 < 0x19)) &&
       ((0x1800c0fU >> (uVar3 & 0x1f) & 1) != 0)) {
      this->anyVars = true;
    }
  }
  else {
    sVar1 = (expr->super_AssignmentPatternExpressionBase).elements_.size_;
    if (sVar1 != 0) {
      ppEVar2 = (expr->super_AssignmentPatternExpressionBase).elements_.data_;
      lVar5 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar2 + lVar5);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ExpressionVarVisitor&>
                  (this_00,this_00,this);
        lVar5 = lVar5 + 8;
      } while (sVar1 << 3 != lVar5);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (VariableSymbol::isKind(sym->kind))
                            anyVars = true;
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                ExpressionVarVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }